

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyEmFromI(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  TidyTagId tid;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    if (node->tag != (Dict *)0x0) {
      TVar1 = node->tag->id;
      tid = TidyTag_EM;
      if (TVar1 != TidyTag_I) {
        if (TVar1 != TidyTag_B) goto LAB_00137299;
        tid = TidyTag_STRONG;
      }
      RenameElem(doc,node,tid);
    }
LAB_00137299:
    if (node->content != (Node *)0x0) {
      prvTidyEmFromI(doc,node->content);
    }
    node = node->next;
  } while( true );
}

Assistant:

void TY_(EmFromI)( TidyDocImpl* doc, Node* node )
{
    while (node)
    {
        if ( nodeIsI(node) )
            RenameElem( doc, node, TidyTag_EM );
        else if ( nodeIsB(node) )
            RenameElem( doc, node, TidyTag_STRONG );

        if ( node->content )
            TY_(EmFromI)( doc, node->content );

        node = node->next;
    }
}